

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O3

double * genLags(double *y,int N,int mlags,int *rows,int *cols)

{
  size_t __n;
  double *__dest;
  int iVar1;
  double *__dest_00;
  ulong uVar2;
  
  if (mlags < 1) {
    __dest = (double *)calloc((long)N,8);
  }
  else {
    if (mlags != 1) {
      iVar1 = N - mlags;
      N = iVar1 + 1;
      __n = (long)iVar1 * 8 + 8;
      uVar2 = (ulong)(uint)mlags;
      __dest = (double *)malloc(__n * uVar2);
      __dest_00 = __dest;
      do {
        memcpy(__dest_00,y + (uVar2 - 1),__n);
        __dest_00 = __dest_00 + (long)iVar1 + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
      goto LAB_0014bf02;
    }
    __dest = (double *)malloc((long)N << 3);
    memcpy(__dest,y,(long)N << 3);
  }
  mlags = 1;
LAB_0014bf02:
  *rows = mlags;
  *cols = N;
  return __dest;
}

Assistant:

double* genLags(double *y, int N, int mlags, int *rows, int *cols) {
    int i;
    double *out;

    if (mlags <= 0) {
        out = (double*)calloc(N,sizeof(double));
        *rows = 1;
        *cols = N;
        return out;
    }

    if (mlags == 1) {
        out = (double*) malloc(sizeof(double)*N);
        memcpy(out,y,sizeof(double)*N);
        *rows = 1;
        *cols = N;
        return out;
    }

    out = (double*) malloc(sizeof(double) * (N-mlags+1)*mlags);

    for(i = 0; i < mlags;++i) {
        memcpy(out+(N-mlags+1)*i,y+mlags-1-i,sizeof(double)*(N-mlags+1));
    }

    *rows = mlags;
    *cols = N - mlags + 1;

    return out;

}